

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  SessionHandle *data;
  SessionHandle *data_00;
  void *pvVar1;
  long lVar2;
  byte bVar3;
  CURLcode CVar4;
  size_t insize;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *authorization;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  data = conn->data;
  if (authstatus->picked != 1) {
    if (authstatus->picked == 2) {
      CVar4 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      pcVar5 = "Digest";
    }
    else {
      pcVar5 = (char *)0x0;
    }
    goto LAB_0055c5dc;
  }
  if (proxy) {
    if (((conn->bits).proxy_user_passwd != true) ||
       (pcVar5 = Curl_checkProxyheaders(conn,"Proxy-authorization:"), pcVar5 != (char *)0x0)) {
      if (!proxy) goto LAB_0055c5b4;
      goto LAB_0055c5d2;
    }
LAB_0055c645:
    local_38 = 0;
    local_48 = (char *)0x0;
    data_00 = conn->data;
    local_40 = 0x300;
    if (proxy) {
      local_40 = 0x2e8;
    }
    pcVar5 = (data_00->state).buffer;
    curl_msnprintf(pcVar5,0x4001,"%s:%s",
                   *(undefined8 *)(conn->local_ip + (ulong)proxy * 0x20 + 0x38),
                   *(undefined8 *)(conn->local_ip + (ulong)proxy * 0x20 + 0x40));
    insize = strlen(pcVar5);
    CVar4 = Curl_base64_encode(data_00,pcVar5,insize,&local_48,&local_38);
    lVar2 = local_40;
    if (CVar4 == CURLE_OK) {
      if (local_48 == (char *)0x0) {
        CVar4 = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        pvVar1 = *(void **)((conn->chunk).hexbuffer + local_40 + -8);
        if (pvVar1 != (void *)0x0) {
          (*Curl_cfree)(pvVar1);
          pcVar5 = (conn->chunk).hexbuffer + lVar2 + -8;
          pcVar5[0] = '\0';
          pcVar5[1] = '\0';
          pcVar5[2] = '\0';
          pcVar5[3] = '\0';
          pcVar5[4] = '\0';
          pcVar5[5] = '\0';
          pcVar5[6] = '\0';
          pcVar5[7] = '\0';
        }
        pcVar5 = "";
        if (proxy) {
          pcVar5 = "Proxy-";
        }
        pcVar5 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar5,local_48);
        *(char **)((conn->chunk).hexbuffer + lVar2 + -8) = pcVar5;
        (*Curl_cfree)(local_48);
        CVar4 = CURLE_OUT_OF_MEMORY;
        if (*(long *)((conn->chunk).hexbuffer + lVar2 + -8) != 0) {
          CVar4 = CURLE_OK;
        }
      }
    }
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pcVar5 = "Basic";
  }
  else {
LAB_0055c5b4:
    if (((conn->bits).user_passwd == true) &&
       (pcVar5 = Curl_checkheaders(conn,"Authorization:"), pcVar5 == (char *)0x0))
    goto LAB_0055c645;
LAB_0055c5d2:
    pcVar5 = (char *)0x0;
  }
  authstatus->done = true;
LAB_0055c5dc:
  if (pcVar5 == (char *)0x0) {
    bVar3 = false;
  }
  else {
    pcVar6 = "Server";
    if (proxy) {
      pcVar6 = "Proxy";
    }
    pcVar7 = "";
    if (*(char **)(conn->local_ip + (ulong)proxy * 0x20 + 0x38) != (char *)0x0) {
      pcVar7 = *(char **)(conn->local_ip + (ulong)proxy * 0x20 + 0x38);
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar6,pcVar5,pcVar7);
    bVar3 = authstatus->done ^ 1;
  }
  authstatus->multi = (_Bool)bVar3;
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  struct SessionHandle *data = conn->data;
  const char *auth=NULL;
  CURLcode result = CURLE_OK;
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy?
    &data->state.proxyneg:&data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth="Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth="NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth="NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth="Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization:")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth="Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }
    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy?"Proxy":"Server", auth,
          proxy?(conn->proxyuser?conn->proxyuser:""):
                (conn->user?conn->user:""));
    authstatus->multi = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multi = FALSE;

  return CURLE_OK;
}